

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O3

bool __thiscall
crnlib::crn_comp::pack_color_selectors
          (crn_comp *this,vector<unsigned_char> *packed_data,vector<unsigned_short> *remapping)

{
  int *piVar1;
  uint min_new_capacity;
  uint uVar2;
  uchar *puVar3;
  undefined8 uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  vector<unsigned_int> remapped_selectors;
  symbol_histogram hist;
  static_huffman_data_model dm;
  elemental_vector local_128;
  elemental_vector local_118;
  vector<unsigned_char> *local_108;
  static_huffman_data_model local_100;
  symbol_codec local_c8;
  
  min_new_capacity = (this->m_color_selectors).m_size;
  local_128.m_p = (void *)0x0;
  local_128.m_size = 0;
  local_128.m_capacity = 0;
  if (min_new_capacity != 0) {
    elemental_vector::increase_capacity
              (&local_128,min_new_capacity,min_new_capacity == 1,4,(object_mover)0x0,false);
    memset((void *)((local_128._8_8_ & 0xffffffff) * 4 + (long)local_128.m_p),0,
           (ulong)(min_new_capacity - local_128.m_size) << 2);
    local_128.m_size = min_new_capacity;
    if ((this->m_color_selectors).m_size != 0) {
      uVar5 = 0;
      do {
        *(uint *)((long)local_128.m_p + (ulong)remapping->m_p[uVar5] * 4) =
             (this->m_color_selectors).m_p[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar5 < (this->m_color_selectors).m_size);
    }
  }
  local_118.m_p = (void *)0x0;
  local_118.m_size = 0;
  local_118.m_capacity = 0;
  elemental_vector::increase_capacity(&local_118,0x10,false,4,(object_mover)0x0,false);
  memset((void *)((local_118._8_8_ & 0xffffffff) * 4 + (long)local_118.m_p),0,
         (ulong)(0x10 - local_118.m_size) << 2);
  local_118.m_size = 0x10;
  if (local_128.m_size != 0) {
    uVar5 = 0;
    uVar6 = 0;
    do {
      uVar2 = *(uint *)((long)local_128.m_p + uVar5 * 4);
      uVar6 = uVar6 ^ uVar2;
      iVar7 = -8;
      do {
        piVar1 = (int *)((long)local_118.m_p + (ulong)(uVar6 & 0xf) * 4);
        *piVar1 = *piVar1 + 1;
        uVar6 = uVar6 >> 4;
        iVar7 = iVar7 + 1;
      } while (iVar7 != 0);
      uVar5 = uVar5 + 1;
      uVar6 = uVar2;
    } while (uVar5 < (local_128._8_8_ & 0xffffffff));
  }
  static_huffman_data_model::static_huffman_data_model(&local_100);
  static_huffman_data_model::init(&local_100,(EVP_PKEY_CTX *)0x1);
  symbol_codec::symbol_codec(&local_c8);
  local_108 = packed_data;
  symbol_codec::start_encoding(&local_c8,0x100000);
  symbol_codec::encode_transmit_static_huffman_data_model
            (&local_c8,&local_100,false,(static_huffman_data_model *)0x0);
  if (local_128.m_size != 0) {
    uVar5 = 0;
    uVar6 = 0;
    do {
      uVar2 = *(uint *)((long)local_128.m_p + uVar5 * 4);
      uVar6 = uVar6 ^ uVar2;
      iVar7 = -8;
      do {
        symbol_codec::encode(&local_c8,uVar6 & 0xf,&local_100);
        uVar6 = uVar6 >> 4;
        iVar7 = iVar7 + 1;
      } while (iVar7 != 0);
      uVar5 = uVar5 + 1;
      uVar6 = uVar2;
    } while (uVar5 < (local_128._8_8_ & 0xffffffff));
  }
  symbol_codec::stop_encoding(&local_c8,false);
  puVar3 = local_108->m_p;
  local_108->m_p = local_c8.m_output_buf.m_p;
  uVar4._0_4_ = local_108->m_size;
  uVar4._4_4_ = local_108->m_capacity;
  local_108->m_size = local_c8.m_output_buf.m_size;
  local_108->m_capacity = local_c8.m_output_buf.m_capacity;
  local_c8.m_output_buf.m_p = puVar3;
  local_c8.m_output_buf._8_8_ = uVar4;
  if (local_c8.m_output_syms.m_p != (output_symbol *)0x0) {
    crnlib_free(local_c8.m_output_syms.m_p);
  }
  if (local_c8.m_arith_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_c8.m_arith_output_buf.m_p);
  }
  if (local_c8.m_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_c8.m_output_buf.m_p);
  }
  static_huffman_data_model::~static_huffman_data_model(&local_100);
  if (local_118.m_p != (void *)0x0) {
    crnlib_free(local_118.m_p);
  }
  if (local_128.m_p != (void *)0x0) {
    crnlib_free(local_128.m_p);
  }
  return true;
}

Assistant:

bool crn_comp::pack_color_selectors(crnlib::vector<uint8>& packed_data, const crnlib::vector<uint16>& remapping) {
  crnlib::vector<uint32> remapped_selectors(m_color_selectors.size());
  for (uint i = 0; i < m_color_selectors.size(); i++)
    remapped_selectors[remapping[i]] = m_color_selectors[i];
  symbol_histogram hist(16);
  for (uint32 c, selector, prev_selector = 0, i = 0; i < remapped_selectors.size(); i++) {
    for (selector = prev_selector ^ remapped_selectors[i], prev_selector ^= selector, c = 8; c; c--, selector >>= 4)
      hist.inc_freq(selector & 0xF);
  }
  static_huffman_data_model dm;
  dm.init(true, hist, 15);
  symbol_codec codec;
  codec.start_encoding(1024 * 1024);
  codec.encode_transmit_static_huffman_data_model(dm, false);
  for (uint32 c, selector, prev_selector = 0, i = 0; i < remapped_selectors.size(); i++) {
    for (selector = prev_selector ^ remapped_selectors[i], prev_selector ^= selector, c = 8; c; c--, selector >>= 4)
      codec.encode(selector & 0xF, dm);
  }
  codec.stop_encoding(false);
  packed_data.swap(codec.get_encoding_buf());
  return true;
}